

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

int bcf_get_info_values(bcf_hdr_t *hdr,bcf1_t *line,char *tag,void **dst,int *ndst,int type)

{
  bcf_info_t *pbVar1;
  uint8_t *puVar2;
  int iVar3;
  void *pvVar4;
  float *p_3;
  float *tmp_3;
  int32_t *p_2;
  int32_t *tmp_2;
  int16_t *p_1;
  int32_t *tmp_1;
  int8_t *p;
  int32_t *tmp;
  int size1;
  bcf_info_t *info;
  int tag_id;
  int j;
  int i;
  int type_local;
  int *ndst_local;
  void **dst_local;
  char *tag_local;
  bcf1_t *line_local;
  bcf_hdr_t *hdr_local;
  
  iVar3 = bcf_hdr_id2int(hdr,0,tag);
  if ((iVar3 < 0) || (((hdr->id[0][iVar3].val)->info[1] & 0xf) == 0xf)) {
    hdr_local._4_4_ = -1;
  }
  else if (((hdr->id[0][iVar3].val)->info[1] >> 4 & 0xf) == type) {
    if ((line->unpacked & 4U) == 0) {
      bcf_unpack(line,4);
    }
    tag_id = 0;
    while ((tag_id < (int)((uint)*(undefined8 *)&line->field_0x10 & 0xffff) &&
           ((line->d).info[tag_id].key != iVar3))) {
      tag_id = tag_id + 1;
    }
    if (tag_id == ((uint)*(undefined8 *)&line->field_0x10 & 0xffff)) {
      hdr_local._4_4_ = -3;
      if (type == 0) {
        hdr_local._4_4_ = 0;
      }
    }
    else if (type == 0) {
      hdr_local._4_4_ = 1;
    }
    else {
      pbVar1 = (line->d).info;
      if (type == 3) {
        if (*ndst < pbVar1[tag_id].len + 1) {
          *ndst = pbVar1[tag_id].len + 1;
          pvVar4 = realloc(*dst,(long)*ndst);
          *dst = pvVar4;
        }
        memcpy(*dst,pbVar1[tag_id].vptr,(long)pbVar1[tag_id].len);
        *(undefined1 *)((long)*dst + (long)pbVar1[tag_id].len) = 0;
        hdr_local._4_4_ = pbVar1[tag_id].len;
      }
      else {
        if (*ndst < pbVar1[tag_id].len) {
          *ndst = pbVar1[tag_id].len;
          pvVar4 = realloc(*dst,(long)(*ndst * 4));
          *dst = pvVar4;
        }
        if (pbVar1[tag_id].len == 1) {
          if (pbVar1[tag_id].type == 5) {
            *(anon_union_4_2_947300a4_for_v1 *)*dst = pbVar1[tag_id].v1;
          }
          else {
            iVar3 = pbVar1[tag_id].type;
            if (iVar3 == 1) {
              if (pbVar1[tag_id].v1.i == -0x80) {
                *(undefined4 *)*dst = 0x80000000;
              }
              else {
                *(anon_union_4_2_947300a4_for_v1 *)*dst = pbVar1[tag_id].v1;
              }
            }
            else if (iVar3 == 2) {
              if (pbVar1[tag_id].v1.i == -0x8000) {
                *(undefined4 *)*dst = 0x80000000;
              }
              else {
                *(anon_union_4_2_947300a4_for_v1 *)*dst = pbVar1[tag_id].v1;
              }
            }
            else if (iVar3 == 3) {
              if (pbVar1[tag_id].v1.i == -0x80000000) {
                *(undefined4 *)*dst = 0x80000000;
              }
              else {
                *(anon_union_4_2_947300a4_for_v1 *)*dst = pbVar1[tag_id].v1;
              }
            }
          }
          hdr_local._4_4_ = 1;
        }
        else {
          switch(pbVar1[tag_id].type) {
          case 1:
            p = (int8_t *)*dst;
            puVar2 = pbVar1[tag_id].vptr;
            for (info._4_4_ = 0; info._4_4_ < pbVar1[tag_id].len; info._4_4_ = info._4_4_ + 1) {
              if (puVar2[info._4_4_] == 0x81) {
                return info._4_4_;
              }
              if (puVar2[info._4_4_] == 0x80) {
                p[0] = '\0';
                p[1] = '\0';
                p[2] = '\0';
                p[3] = -0x80;
              }
              else {
                *(int *)p = (int)(char)puVar2[info._4_4_];
              }
              p = p + 4;
            }
            hdr_local._4_4_ = info._4_4_;
            break;
          case 2:
            p_1 = (int16_t *)*dst;
            puVar2 = pbVar1[tag_id].vptr;
            for (info._4_4_ = 0; info._4_4_ < pbVar1[tag_id].len; info._4_4_ = info._4_4_ + 1) {
              if (*(short *)(puVar2 + (long)info._4_4_ * 2) == -0x7fff) {
                return info._4_4_;
              }
              if (*(short *)(puVar2 + (long)info._4_4_ * 2) == -0x8000) {
                p_1[0] = 0;
                p_1[1] = -0x8000;
              }
              else {
                *(int *)p_1 = (int)*(short *)(puVar2 + (long)info._4_4_ * 2);
              }
              p_1 = p_1 + 2;
            }
            hdr_local._4_4_ = info._4_4_;
            break;
          case 3:
            p_2 = (int32_t *)*dst;
            puVar2 = pbVar1[tag_id].vptr;
            for (info._4_4_ = 0; info._4_4_ < pbVar1[tag_id].len; info._4_4_ = info._4_4_ + 1) {
              if (*(int *)(puVar2 + (long)info._4_4_ * 4) == -0x7fffffff) {
                return info._4_4_;
              }
              if (*(int *)(puVar2 + (long)info._4_4_ * 4) == -0x80000000) {
                *p_2 = -0x80000000;
              }
              else {
                *p_2 = *(int32_t *)(puVar2 + (long)info._4_4_ * 4);
              }
              p_2 = p_2 + 1;
            }
            hdr_local._4_4_ = info._4_4_;
            break;
          default:
            fprintf(_stderr,"TODO: %s:%d .. info->type=%d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                    ,0xc1d,(ulong)(uint)pbVar1[tag_id].type);
            exit(1);
          case 5:
            p_3 = (float *)*dst;
            puVar2 = pbVar1[tag_id].vptr;
            for (info._4_4_ = 0; info._4_4_ < pbVar1[tag_id].len; info._4_4_ = info._4_4_ + 1) {
              iVar3 = bcf_float_is_vector_end(*(float *)(puVar2 + (long)info._4_4_ * 4));
              if (iVar3 != 0) {
                return info._4_4_;
              }
              iVar3 = bcf_float_is_missing(*(float *)(puVar2 + (long)info._4_4_ * 4));
              if (iVar3 == 0) {
                *p_3 = *(float *)(puVar2 + (long)info._4_4_ * 4);
              }
              else {
                bcf_float_set(p_3,bcf_float_missing);
              }
              p_3 = p_3 + 1;
            }
            hdr_local._4_4_ = info._4_4_;
          }
        }
      }
    }
  }
  else {
    hdr_local._4_4_ = -2;
  }
  return hdr_local._4_4_;
}

Assistant:

int bcf_get_info_values(const bcf_hdr_t *hdr, bcf1_t *line, const char *tag, void **dst, int *ndst, int type)
{
    int i,j, tag_id = bcf_hdr_id2int(hdr, BCF_DT_ID, tag);
    if ( !bcf_hdr_idinfo_exists(hdr,BCF_HL_INFO,tag_id) ) return -1;    // no such INFO field in the header
    if ( bcf_hdr_id2type(hdr,BCF_HL_INFO,tag_id)!=type ) return -2;     // expected different type

    if ( !(line->unpacked & BCF_UN_INFO) ) bcf_unpack(line, BCF_UN_INFO);

    for (i=0; i<line->n_info; i++)
        if ( line->d.info[i].key==tag_id ) break;
    if ( i==line->n_info ) return ( type==BCF_HT_FLAG ) ? 0 : -3;       // the tag is not present in this record
    if ( type==BCF_HT_FLAG ) return 1;

    bcf_info_t *info = &line->d.info[i];
    if ( type==BCF_HT_STR )
    {
        if ( *ndst < info->len+1 )
        {
            *ndst = info->len + 1;
            *dst  = realloc(*dst, *ndst);
        }
        memcpy(*dst,info->vptr,info->len);
        ((uint8_t*)*dst)[info->len] = 0;
        return info->len;
    }

    // Make sure the buffer is big enough
    int size1 = type==BCF_HT_INT ? sizeof(int32_t) : sizeof(float);
    if ( *ndst < info->len )
    {
        *ndst = info->len;
        *dst  = realloc(*dst, *ndst * size1);
    }

    if ( info->len == 1 )
    {
        if ( info->type==BCF_BT_FLOAT ) *((float*)*dst) = info->v1.f;
        else 
        {
            #define BRANCH(type_t, missing) { \
                if ( info->v1.i==missing ) *((int32_t*)*dst) = bcf_int32_missing; \
                else *((int32_t*)*dst) = info->v1.i; \
            }
            switch (info->type)
            {
                case BCF_BT_INT8:  BRANCH(int8_t,  bcf_int8_missing ); break;
                case BCF_BT_INT16: BRANCH(int16_t, bcf_int16_missing); break;
                case BCF_BT_INT32: BRANCH(int32_t, bcf_int32_missing); break;
            }
            #undef BRANCH
        }
        return 1;
    }

    #define BRANCH(type_t, is_missing, is_vector_end, set_missing, out_type_t) { \
        out_type_t *tmp = (out_type_t *) *dst; \
        type_t *p = (type_t *) info->vptr; \
        for (j=0; j<info->len; j++) \
        { \
            if ( is_vector_end ) return j; \
            if ( is_missing ) set_missing; \
            else *tmp = p[j]; \
            tmp++; \
        } \
        return j; \
    }
    switch (info->type) {
        case BCF_BT_INT8:  BRANCH(int8_t,  p[j]==bcf_int8_missing,  p[j]==bcf_int8_vector_end,  *tmp=bcf_int32_missing, int32_t); break;
        case BCF_BT_INT16: BRANCH(int16_t, p[j]==bcf_int16_missing, p[j]==bcf_int16_vector_end, *tmp=bcf_int32_missing, int32_t); break;
        case BCF_BT_INT32: BRANCH(int32_t, p[j]==bcf_int32_missing, p[j]==bcf_int32_vector_end, *tmp=bcf_int32_missing, int32_t); break;
        case BCF_BT_FLOAT: BRANCH(float,   bcf_float_is_missing(p[j]), bcf_float_is_vector_end(p[j]), bcf_float_set_missing(*tmp), float); break;
        default: fprintf(stderr,"TODO: %s:%d .. info->type=%d\n", __FILE__,__LINE__, info->type); exit(1);
    }
    #undef BRANCH
    return -4;  // this can never happen
}